

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  ushort *puVar8;
  char *pcVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  char cVar13;
  ushort *puVar14;
  ushort *puVar15;
  byte *pbVar16;
  size_t prefixSize;
  uint uVar17;
  long lVar18;
  long lVar19;
  ushort *puVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uStack_c0;
  byte *pbStack_a0;
  ulong uStack_80;
  ulong uStack_70;
  int iStack_60;
  
  iVar7 = (int)dest;
  iStack_60 = (int)source;
  if (dictSize == 0) {
    puVar8 = (ushort *)0xffffffffffffffff;
    if (source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          puVar8 = (ushort *)(ulong)-(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar1 = (ushort *)(source + compressedSize);
        pbVar2 = (byte *)(dest + maxOutputSize);
        puVar14 = (ushort *)(source + (long)compressedSize + -0x10);
        puVar8 = (ushort *)source;
        pbVar23 = (byte *)dest;
        if (maxOutputSize < 0x40) goto LAB_00103b0c;
        puVar15 = (ushort *)((long)puVar1 - 0xf);
        puVar20 = (ushort *)source;
LAB_001035c0:
        pbVar22 = pbVar23;
        bVar3 = (byte)*puVar20;
        uVar11 = (uint)bVar3;
        puVar8 = (ushort *)((long)puVar20 + 1);
        uVar26 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          uVar26 = 0xf;
          puVar20 = puVar8;
          if (puVar8 < puVar15) {
            uVar17 = 0;
            do {
              uVar5 = *puVar20;
              puVar20 = (ushort *)((long)puVar20 + 1);
              uVar17 = uVar17 + (byte)uVar5;
            } while (puVar20 < puVar15 && (byte)uVar5 == 0xff);
            uVar26 = (ulong)uVar17 + 0xf;
          }
          pbVar23 = pbVar22 + uVar26;
          if (((puVar15 <= puVar8) || (CARRY8((ulong)pbVar22,uVar26))) ||
             (CARRY8((ulong)puVar20,uVar26))) {
            iVar12 = 5;
            puVar8 = puVar20;
          }
          else {
            source = (char *)pbVar23;
            if ((pbVar2 + -0x20 < pbVar23) || (puVar1 + -0x10 < (ushort *)((long)puVar20 + uVar26)))
            {
              iVar12 = 6;
              puVar8 = puVar20;
            }
            else {
              lVar19 = 0;
              do {
                uVar4 = *(undefined8 *)((byte *)((long)puVar20 + lVar19) + 8);
                pbVar24 = pbVar22 + lVar19;
                *(undefined8 *)pbVar24 = *(undefined8 *)((long)puVar20 + lVar19);
                *(undefined8 *)(pbVar24 + 8) = uVar4;
                pbVar21 = (byte *)((long)puVar20 + lVar19 + 0x10);
                uVar4 = *(undefined8 *)(pbVar21 + 8);
                *(undefined8 *)(pbVar24 + 0x10) = *(undefined8 *)pbVar21;
                *(undefined8 *)(pbVar24 + 0x18) = uVar4;
                lVar19 = lVar19 + 0x20;
              } while (pbVar24 + 0x20 < pbVar23);
              iVar12 = 0;
              puVar8 = (ushort *)((long)puVar20 + uVar26);
              pbVar22 = pbVar23;
            }
          }
          if (iVar12 != 0) {
            if (iVar12 != 5) {
              if (iVar12 == 6) goto LAB_00103a1b;
              goto LAB_00103909;
            }
            goto LAB_00103bd0;
          }
        }
        else {
          source = (char *)(pbVar22 + uVar26);
          if ((ushort *)((long)puVar1 - 0x11U) < puVar8) goto LAB_00103a1b;
          uVar4 = *(undefined8 *)((long)puVar20 + 9);
          *(undefined8 *)pbVar22 = *(undefined8 *)puVar8;
          *(undefined8 *)(pbVar22 + 8) = uVar4;
          puVar8 = (ushort *)(uVar26 + (long)puVar8);
          pbVar22 = (byte *)source;
        }
        uVar5 = *puVar8;
        uVar28 = (ulong)uVar5;
        puVar8 = puVar8 + 1;
        pbVar24 = pbVar22 + -uVar28;
        uVar26 = (ulong)(bVar3 & 0xf);
        if (uVar26 == 0xf) {
          if (pbVar24 < dest) {
            iVar12 = 5;
            uStack_70 = 0xf;
          }
          else {
            uVar11 = 0;
            do {
              uVar6 = *puVar8;
              puVar8 = (ushort *)((long)puVar8 + 1);
              uVar11 = uVar11 + (byte)uVar6;
            } while ((byte)uVar6 == 0xff && puVar8 < puVar1 + -2);
            uVar26 = (ulong)uVar11;
            uStack_70 = uVar26 + 0xf;
            if ((puVar1 + -2 <= puVar8) || (CARRY8((ulong)pbVar22,uStack_70))) {
              iVar12 = 5;
            }
            else {
              uStack_70 = uVar26 + 0x13;
              iVar12 = 7;
              if (pbVar22 + uVar26 + 0x13 < pbVar2 + -0x40) {
                iVar12 = 0;
              }
            }
          }
          if (iVar12 != 0) {
            if (iVar12 != 5) {
              if (iVar12 != 7) goto LAB_00103909;
              goto LAB_00103aac;
            }
            goto LAB_00103bd0;
          }
        }
        else {
          uStack_70 = uVar26 + 4;
          if (pbVar2 + -0x40 <= pbVar22 + uVar26 + 4) goto LAB_00103aac;
          if ((dest <= pbVar24) && (7 < uVar5)) {
            *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
            *(undefined8 *)(pbVar22 + 8) = *(undefined8 *)(pbVar24 + 8);
            *(undefined2 *)(pbVar22 + 0x10) = *(undefined2 *)(pbVar24 + 0x10);
            puVar20 = puVar8;
            pbVar23 = pbVar22 + uVar26 + 4;
            goto LAB_001035c0;
          }
        }
        if (pbVar24 < dest) goto LAB_00103bd0;
        source = (char *)(pbVar22 + uStack_70);
        puVar20 = puVar8;
        if (uVar5 < 0x10) {
          if (uVar28 == 4) {
            iVar12 = *(int *)pbVar24;
LAB_001037ff:
            *(int *)pbVar22 = iVar12;
            *(int *)(pbVar22 + 4) = iVar12;
            pbVar23 = (byte *)source;
            if (8 < uStack_70) {
              pbVar22 = pbVar22 + 8;
              do {
                *(int *)pbVar22 = iVar12;
                *(int *)(pbVar22 + 4) = iVar12;
                pbVar22 = pbVar22 + 8;
                pbVar23 = (byte *)source;
              } while (pbVar22 < source);
            }
          }
          else {
            if (uVar5 == 2) {
              iVar12 = CONCAT22(*(undefined2 *)pbVar24,*(undefined2 *)pbVar24);
              goto LAB_001037ff;
            }
            if (uVar5 == 1) {
              iVar12 = (uint)*pbVar24 * 0x1010101;
              goto LAB_001037ff;
            }
            if (uVar5 < 8) {
              pbVar22[0] = 0;
              pbVar22[1] = 0;
              pbVar22[2] = 0;
              pbVar22[3] = 0;
              *pbVar22 = *pbVar24;
              pbVar22[1] = pbVar24[1];
              pbVar22[2] = pbVar24[2];
              pbVar22[3] = pbVar24[3];
              uVar11 = inc32table[uVar5];
              *(undefined4 *)(pbVar22 + 4) = *(undefined4 *)(pbVar24 + uVar11);
              pbVar24 = pbVar24 + ((ulong)uVar11 - (long)dec64table[uVar5]);
            }
            else {
              *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
              pbVar24 = pbVar24 + 8;
            }
            pbVar22 = pbVar22 + 8;
            do {
              *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
              pbVar22 = pbVar22 + 8;
              pbVar24 = pbVar24 + 8;
              pbVar23 = (byte *)source;
            } while (pbVar22 < source);
          }
        }
        else {
          do {
            uVar4 = *(undefined8 *)(pbVar22 + -uVar28 + 8);
            *(undefined8 *)pbVar22 = *(undefined8 *)(pbVar22 + -uVar28);
            *(undefined8 *)(pbVar22 + 8) = uVar4;
            uVar4 = *(undefined8 *)(pbVar22 + -uVar28 + 0x10 + 8);
            *(undefined8 *)(pbVar22 + 0x10) = *(undefined8 *)(pbVar22 + -uVar28 + 0x10);
            *(undefined8 *)(pbVar22 + 0x18) = uVar4;
            pbVar22 = pbVar22 + 0x20;
            pbVar23 = (byte *)source;
          } while (pbVar22 < source);
        }
        goto LAB_001035c0;
      }
    }
    goto LAB_00103909;
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize != dest) {
    puVar8 = (ushort *)0xffffffffffffffff;
    if (source != (char *)0x0) {
      pcVar9 = dictStart + prefixSize;
      if (dictStart == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          puVar8 = (ushort *)(ulong)-(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar1 = (ushort *)(source + compressedSize);
        pbVar2 = (byte *)(dest + maxOutputSize);
        pbVar23 = (byte *)dest;
        puVar8 = (ushort *)source;
        if (maxOutputSize < 0x40) goto LAB_00105235;
        puVar14 = (ushort *)((long)puVar1 - 0xf);
        puVar15 = (ushort *)source;
LAB_00104b32:
        bVar3 = (byte)*puVar15;
        uVar11 = (uint)bVar3;
        puVar20 = (ushort *)((long)puVar15 + 1);
        uVar26 = (ulong)(uint)(bVar3 >> 4);
        puVar8 = puVar20;
        if (bVar3 >> 4 == 0xf) {
          uVar26 = 0xf;
          if (puVar20 < puVar14) {
            uVar17 = 0;
            do {
              uVar5 = *puVar8;
              puVar8 = (ushort *)((long)puVar8 + 1);
              uVar17 = uVar17 + (byte)uVar5;
            } while (puVar8 < puVar14 && (byte)uVar5 == 0xff);
            uVar26 = (ulong)uVar17 + 0xf;
          }
          pbVar22 = pbVar23 + uVar26;
          if (((puVar14 <= puVar20) || (CARRY8((ulong)pbVar23,uVar26))) ||
             (CARRY8((ulong)puVar8,uVar26))) {
            iVar12 = 5;
            pbVar22 = pbVar23;
          }
          else {
            pbStack_a0 = pbVar22;
            if ((pbVar2 + -0x20 < pbVar22) || (puVar1 + -0x10 < (ushort *)((long)puVar8 + uVar26)))
            {
              iVar12 = 6;
              pbVar22 = pbVar23;
            }
            else {
              lVar19 = 0;
              do {
                uVar4 = *(undefined8 *)((byte *)((long)puVar8 + lVar19) + 8);
                pbVar24 = pbVar23 + lVar19;
                *(undefined8 *)pbVar24 = *(undefined8 *)((long)puVar8 + lVar19);
                *(undefined8 *)(pbVar24 + 8) = uVar4;
                pbVar21 = (byte *)((long)puVar8 + lVar19 + 0x10);
                uVar4 = *(undefined8 *)(pbVar21 + 8);
                *(undefined8 *)(pbVar24 + 0x10) = *(undefined8 *)pbVar21;
                *(undefined8 *)(pbVar24 + 0x18) = uVar4;
                lVar19 = lVar19 + 0x20;
              } while (pbVar24 + 0x20 < pbVar22);
              iVar12 = 0;
              puVar8 = (ushort *)((long)puVar8 + uVar26);
            }
          }
          if (iVar12 != 0) {
            if (iVar12 != 5) {
              pbVar23 = pbVar22;
              if (iVar12 == 6) goto LAB_0010505a;
              goto LAB_00105300;
            }
            goto LAB_001052f8;
          }
        }
        else {
          pbVar22 = pbVar23 + uVar26;
          pbStack_a0 = pbVar22;
          if ((ushort *)((long)puVar1 - 0x11U) < puVar20) goto LAB_0010505a;
          uVar4 = *(undefined8 *)((long)puVar15 + 9);
          *(undefined8 *)pbVar23 = *(undefined8 *)puVar20;
          *(undefined8 *)(pbVar23 + 8) = uVar4;
          puVar8 = (ushort *)(uVar26 + (long)puVar20);
        }
        uVar5 = *puVar8;
        uVar28 = (ulong)uVar5;
        puVar8 = puVar8 + 1;
        pbVar24 = pbVar22 + -uVar28;
        uVar26 = (ulong)(bVar3 & 0xf);
        if (uVar26 == 0xf) {
          if ((prefixSize < 0x10000) && (pbVar24 + prefixSize < dest)) {
            iVar12 = 5;
            uStack_c0 = 0xf;
          }
          else {
            uVar11 = 0;
            do {
              uVar6 = *puVar8;
              puVar8 = (ushort *)((long)puVar8 + 1);
              uVar11 = uVar11 + (byte)uVar6;
            } while ((byte)uVar6 == 0xff && puVar8 < puVar1 + -2);
            uVar26 = (ulong)uVar11;
            uStack_c0 = uVar26 + 0xf;
            if ((puVar1 + -2 <= puVar8) || (CARRY8((ulong)pbVar22,uStack_c0))) {
              iVar12 = 5;
            }
            else {
              uStack_c0 = uVar26 + 0x13;
              iVar12 = 7;
              if (pbVar22 + uVar26 + 0x13 < pbVar2 + -0x40) {
                iVar12 = 0;
              }
            }
          }
          if (iVar12 != 0) {
            if (iVar12 != 5) {
              if (iVar12 == 7) goto LAB_00105103;
              goto LAB_00105300;
            }
            goto LAB_001052f8;
          }
        }
        else {
          uStack_c0 = uVar26 + 4;
          if (pbVar2 + -0x40 <= pbVar22 + uVar26 + 4) goto LAB_00105103;
          if ((dest <= pbVar24) && (7 < uVar5)) {
            *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
            *(undefined8 *)(pbVar22 + 8) = *(undefined8 *)(pbVar24 + 8);
            *(undefined2 *)(pbVar22 + 0x10) = *(undefined2 *)(pbVar24 + 0x10);
            pbVar23 = pbVar22 + uVar26 + 4;
            puVar15 = puVar8;
            goto LAB_00104b32;
          }
        }
        if ((prefixSize < 0x10000) && (pbVar24 + prefixSize < dest)) goto LAB_001052f8;
        pbVar21 = pbVar22 + uStack_c0;
        pbVar23 = pbVar21;
        puVar15 = puVar8;
        if (dest <= pbVar24) {
          pbStack_a0 = pbVar21;
          if (0xf < uVar5) {
            do {
              uVar4 = *(undefined8 *)(pbVar22 + -uVar28 + 8);
              *(undefined8 *)pbVar22 = *(undefined8 *)(pbVar22 + -uVar28);
              *(undefined8 *)(pbVar22 + 8) = uVar4;
              uVar4 = *(undefined8 *)(pbVar22 + -uVar28 + 0x10 + 8);
              *(undefined8 *)(pbVar22 + 0x10) = *(undefined8 *)(pbVar22 + -uVar28 + 0x10);
              *(undefined8 *)(pbVar22 + 0x18) = uVar4;
              pbVar22 = pbVar22 + 0x20;
            } while (pbVar22 < pbVar21);
            goto LAB_00104b32;
          }
          if (uVar28 == 4) {
            iVar12 = *(int *)pbVar24;
          }
          else if (uVar5 == 2) {
            iVar12 = CONCAT22(*(undefined2 *)pbVar24,*(undefined2 *)pbVar24);
          }
          else {
            if (uVar5 != 1) {
              if (uVar5 < 8) {
                pbVar22[0] = 0;
                pbVar22[1] = 0;
                pbVar22[2] = 0;
                pbVar22[3] = 0;
                *pbVar22 = *pbVar24;
                pbVar22[1] = pbVar24[1];
                pbVar22[2] = pbVar24[2];
                pbVar22[3] = pbVar24[3];
                uVar11 = inc32table[uVar5];
                *(undefined4 *)(pbVar22 + 4) = *(undefined4 *)(pbVar24 + uVar11);
                pbVar24 = pbVar24 + ((ulong)uVar11 - (long)dec64table[uVar5]);
              }
              else {
                *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
                pbVar24 = pbVar24 + 8;
              }
              pbVar22 = pbVar22 + 8;
              do {
                *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
                pbVar22 = pbVar22 + 8;
                pbVar24 = pbVar24 + 8;
              } while (pbVar22 < pbVar21);
              goto LAB_00104b32;
            }
            iVar12 = (uint)*pbVar24 * 0x1010101;
          }
          *(int *)pbVar22 = iVar12;
          *(int *)(pbVar22 + 4) = iVar12;
          if (8 < uStack_c0) {
            pbVar22 = pbVar22 + 8;
            do {
              *(int *)pbVar22 = iVar12;
              *(int *)(pbVar22 + 4) = iVar12;
              pbVar22 = pbVar22 + 8;
            } while (pbVar22 < pbVar21);
          }
          goto LAB_00104b32;
        }
        if (pbVar2 + -5 < pbVar21) goto LAB_001052f8;
        uVar28 = (long)dest - (long)pbVar24;
        uVar26 = uStack_c0 - uVar28;
        if (uStack_c0 < uVar28 || uVar26 == 0) {
          memmove(pbVar22,pcVar9 + -uVar28,uStack_c0);
        }
        else {
          memcpy(pbVar22,pcVar9 + -uVar28,uVar28);
          pbVar23 = pbVar22 + uVar28;
          if ((ulong)((long)pbVar23 - (long)dest) < uVar26) {
            pbVar22 = (byte *)dest;
            if ((long)uVar28 < (long)uStack_c0) {
              do {
                *pbVar23 = *pbVar22;
                pbVar23 = pbVar23 + 1;
                pbVar22 = pbVar22 + 1;
              } while (pbVar23 < pbVar21);
            }
          }
          else {
            memcpy(pbVar23,dest,uVar26);
            pbVar23 = pbVar21;
          }
        }
        goto LAB_00104b32;
      }
    }
    goto LAB_00105300;
  }
  if (dictSize < 0xffff) {
    iVar7 = LZ4_decompress_safe_withSmallPrefix(source,dest,compressedSize,maxOutputSize,prefixSize)
    ;
    return iVar7;
  }
  puVar8 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar8 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxOutputSize);
      puVar14 = (ushort *)(source + (long)compressedSize + -0x10);
      pbVar23 = (byte *)dest;
      if (maxOutputSize < 0x40) goto LAB_00104944;
      puVar15 = (ushort *)((long)puVar1 - 0xf);
      pbVar22 = (byte *)source;
      lVar19 = 0;
LAB_001043fe:
      do {
        pbVar23 = (byte *)(dest + lVar19);
        bVar3 = (byte)*(ushort *)source;
        uVar11 = (uint)bVar3;
        puVar8 = (ushort *)((long)source + 1);
        uVar26 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          uVar26 = 0xf;
          source = (char *)puVar8;
          if (puVar8 < puVar15) {
            uVar17 = 0;
            do {
              uVar5 = *(ushort *)source;
              source = (char *)((long)source + 1);
              uVar17 = uVar17 + (byte)uVar5;
            } while (source < puVar15 && (byte)uVar5 == 0xff);
            uVar26 = (ulong)uVar17 + 0xf;
          }
          if (((puVar15 <= puVar8) || (CARRY8((ulong)pbVar23,uVar26))) ||
             (CARRY8((ulong)source,uVar26))) {
            iVar12 = 5;
          }
          else {
            pbVar22 = (byte *)(dest + uVar26 + lVar19);
            if ((pbVar2 + -0x20 < pbVar22) || (puVar1 + -0x10 < (ushort *)((long)source + uVar26)))
            {
              iVar12 = 6;
            }
            else {
              puVar8 = (ushort *)0x0;
              do {
                uVar4 = *(undefined8 *)((byte *)((long)source + (long)puVar8) + 8);
                pbVar24 = pbVar23 + (long)puVar8;
                *(undefined8 *)pbVar24 = *(undefined8 *)((long)source + (long)puVar8);
                *(undefined8 *)(pbVar24 + 8) = uVar4;
                uVar4 = *(undefined8 *)((byte *)((long)((long)source + 0x10) + (long)puVar8) + 8);
                *(undefined8 *)(pbVar24 + 0x10) =
                     *(undefined8 *)((long)((long)source + 0x10) + (long)puVar8);
                *(undefined8 *)(pbVar24 + 0x18) = uVar4;
                puVar8 = puVar8 + 0x10;
              } while (pbVar24 + 0x20 < pbVar22);
              iVar12 = 0;
              lVar19 = uVar26 + lVar19;
              source = (char *)((long)source + uVar26);
            }
          }
          if (iVar12 != 0) {
            if (iVar12 == 5) goto LAB_00104a06;
            if (iVar12 == 6) {
              pbVar23 = (byte *)(dest + lVar19);
              puVar8 = (ushort *)source;
              goto LAB_0010484c;
            }
            break;
          }
        }
        else {
          lVar19 = lVar19 + uVar26;
          pbVar22 = (byte *)(dest + lVar19);
          if ((ushort *)((long)puVar1 - 0x11U) < puVar8) goto LAB_0010484c;
          uVar4 = *(undefined8 *)((long)source + 9);
          *(undefined8 *)pbVar23 = *(undefined8 *)puVar8;
          *(undefined8 *)(pbVar23 + 8) = uVar4;
          source = (char *)(uVar26 + (long)puVar8);
        }
        pbVar24 = (byte *)(dest + lVar19);
        uVar5 = *(ushort *)source;
        uVar28 = (ulong)uVar5;
        source = (char *)((long)source + 2);
        lVar27 = lVar19 - uVar28;
        pbVar21 = (byte *)(dest + lVar27);
        uStack_80 = (ulong)(bVar3 & 0xf);
        if (uStack_80 == 0xf) {
          if (lVar27 < -0x10000) {
            iVar12 = 5;
            uStack_80 = 0xf;
          }
          else {
            uVar11 = 0;
            do {
              uVar6 = *(ushort *)source;
              source = (char *)((long)source + 1);
              uVar11 = uVar11 + (byte)uVar6;
            } while ((byte)uVar6 == 0xff && source < puVar1 + -2);
            uVar26 = (ulong)uVar11;
            uStack_80 = uVar26 + 0xf;
            if ((puVar1 + -2 <= source) || (CARRY8((ulong)pbVar24,uStack_80))) {
              iVar12 = 5;
            }
            else {
              uStack_80 = uVar26 + 0x13;
              iVar12 = 7;
              if (pbVar24 + uVar26 + 0x13 < pbVar2 + -0x40) {
                iVar12 = 0;
              }
            }
          }
          if (iVar12 != 0) {
            if (iVar12 == 5) goto LAB_00104a06;
            puVar8 = (ushort *)source;
            if (iVar12 != 7) break;
            goto LAB_001048e3;
          }
        }
        else {
          lVar18 = lVar19 + uStack_80 + 4;
          uStack_80 = uStack_80 + 4;
          if (pbVar2 + -0x40 <= dest + lVar18) goto LAB_001048e3;
          if (7 < uVar5) {
            *(undefined8 *)pbVar24 = *(undefined8 *)pbVar21;
            *(undefined8 *)(pbVar24 + 8) = *(undefined8 *)(pbVar21 + 8);
            *(undefined2 *)(pbVar24 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
            lVar19 = lVar18;
            goto LAB_001043fe;
          }
        }
        if (lVar27 < -0x10000) goto LAB_00104a06;
        lVar19 = uStack_80 + lVar19;
        pbVar22 = (byte *)(dest + lVar19);
        if (uVar5 < 0x10) {
          if (uVar28 == 4) {
            iVar12 = *(int *)pbVar21;
          }
          else if (uVar5 == 2) {
            iVar12 = CONCAT22(*(undefined2 *)pbVar21,*(undefined2 *)pbVar21);
          }
          else {
            if (uVar5 != 1) {
              if (uVar5 < 8) {
                pbVar24[0] = 0;
                pbVar24[1] = 0;
                pbVar24[2] = 0;
                pbVar24[3] = 0;
                *pbVar24 = *pbVar21;
                pbVar24[1] = pbVar21[1];
                pbVar24[2] = pbVar21[2];
                pbVar24[3] = pbVar21[3];
                uVar11 = inc32table[uVar5];
                *(undefined4 *)(pbVar24 + 4) = *(undefined4 *)(pbVar21 + uVar11);
                pbVar21 = pbVar21 + ((ulong)uVar11 - (long)dec64table[uVar5]);
              }
              else {
                *(undefined8 *)pbVar24 = *(undefined8 *)pbVar21;
                pbVar21 = pbVar21 + 8;
              }
              pbVar24 = pbVar24 + 8;
              do {
                *(undefined8 *)pbVar24 = *(undefined8 *)pbVar21;
                pbVar24 = pbVar24 + 8;
                pbVar21 = pbVar21 + 8;
              } while (pbVar24 < pbVar22);
              goto LAB_001043fe;
            }
            iVar12 = (uint)*pbVar21 * 0x1010101;
          }
          do {
            *(int *)pbVar24 = iVar12;
            *(int *)(pbVar24 + 4) = iVar12;
            pbVar24 = pbVar24 + 8;
          } while (pbVar24 < pbVar22);
          goto LAB_001043fe;
        }
        do {
          uVar4 = *(undefined8 *)(pbVar24 + -uVar28 + 8);
          *(undefined8 *)pbVar24 = *(undefined8 *)(pbVar24 + -uVar28);
          *(undefined8 *)(pbVar24 + 8) = uVar4;
          uVar4 = *(undefined8 *)(pbVar24 + -uVar28 + 0x10 + 8);
          *(undefined8 *)(pbVar24 + 0x10) = *(undefined8 *)(pbVar24 + -uVar28 + 0x10);
          *(undefined8 *)(pbVar24 + 0x18) = uVar4;
          pbVar24 = pbVar24 + 0x20;
        } while (pbVar24 < pbVar22);
      } while( true );
    }
  }
  goto LAB_00104746;
LAB_00103aac:
  if (pbVar24 < dest) goto LAB_00103bd0;
  pbVar23 = pbVar22 + uStack_70;
  if ((uint)uVar28 < 8) {
    pbVar22[0] = 0;
    pbVar22[1] = 0;
    pbVar22[2] = 0;
    pbVar22[3] = 0;
    *pbVar22 = *pbVar24;
    pbVar22[1] = pbVar24[1];
    pbVar22[2] = pbVar24[2];
    pbVar22[3] = pbVar24[3];
    uVar28 = (ulong)((uint)uVar28 << 2);
    uVar26 = (ulong)*(uint *)((long)inc32table + uVar28);
    *(undefined4 *)(pbVar22 + 4) = *(undefined4 *)(pbVar24 + uVar26);
    pbVar24 = pbVar24 + (uVar26 - (long)*(int *)((long)dec64table + uVar28));
  }
  else {
    *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
    pbVar24 = pbVar24 + 8;
  }
  pbVar21 = pbVar22 + 8;
  if (pbVar2 + -0xc < pbVar23) {
    iVar12 = 5;
    if (pbVar23 <= pbVar2 + -5) {
      pbVar22 = pbVar2 + -7;
      pbVar10 = pbVar24;
      pbVar25 = pbVar21;
      if (pbVar21 < pbVar22) {
        do {
          *(undefined8 *)pbVar25 = *(undefined8 *)pbVar10;
          pbVar25 = pbVar25 + 8;
          pbVar10 = pbVar10 + 8;
        } while (pbVar25 < pbVar22);
        pbVar24 = pbVar24 + ((long)pbVar22 - (long)pbVar21);
        pbVar21 = pbVar22;
      }
      iVar12 = 0;
      for (; pbVar21 < pbVar23; pbVar21 = pbVar21 + 1) {
        bVar3 = *pbVar24;
        pbVar24 = pbVar24 + 1;
        *pbVar21 = bVar3;
      }
    }
    if (iVar12 != 0) {
      if (iVar12 != 5) goto LAB_00103909;
      goto LAB_00103bd0;
    }
  }
  else {
    *(undefined8 *)pbVar21 = *(undefined8 *)pbVar24;
    if (0x10 < uStack_70) {
      pbVar22 = pbVar22 + 0x10;
      do {
        pbVar24 = pbVar24 + 8;
        *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
        pbVar22 = pbVar22 + 8;
      } while (pbVar22 < pbVar23);
    }
  }
LAB_00103b0c:
  bVar3 = (byte)*puVar8;
  puVar15 = (ushort *)((long)puVar8 + 1);
  while( true ) {
    uVar11 = (uint)bVar3;
    puVar8 = puVar15;
    if (bVar3 >> 4 == 0xf) break;
    uVar26 = (ulong)(uint)(bVar3 >> 4);
    if ((puVar14 <= puVar15) || (dest + (long)maxOutputSize + -0x20 < pbVar23)) goto LAB_00103a15;
    uVar4 = *(undefined8 *)(puVar15 + 4);
    *(undefined8 *)pbVar23 = *(undefined8 *)puVar15;
    *(undefined8 *)(pbVar23 + 8) = uVar4;
    source = (char *)(pbVar23 + uVar26);
    uStack_70 = (ulong)(uVar11 & 0xf);
    puVar8 = (ushort *)((long)puVar15 + uVar26) + 1;
    uVar5 = *(ushort *)((long)puVar15 + uVar26);
    uVar28 = (ulong)uVar5;
    pbVar24 = (byte *)source + -uVar28;
    if ((((uVar11 & 0xf) == 0xf) || (uVar5 < 8)) || (pbVar24 < dest)) goto LAB_00103a60;
    *(undefined8 *)source = *(undefined8 *)pbVar24;
    *(undefined8 *)((byte *)source + 8) = *(undefined8 *)(pbVar24 + 8);
    *(undefined2 *)((byte *)source + 0x10) = *(undefined2 *)(pbVar24 + 0x10);
    pbVar23 = (byte *)source + uStack_70 + 4;
    bVar3 = *(byte *)((long)puVar15 + uVar26 + 2);
    puVar15 = (ushort *)((long)puVar15 + uVar26 + 3);
  }
  puVar20 = (ushort *)((long)puVar1 - 0xf);
  uVar26 = 0xf;
  if (puVar15 < puVar20) {
    uVar17 = 0;
    do {
      uVar5 = *puVar8;
      puVar8 = (ushort *)((long)puVar8 + 1);
      uVar17 = uVar17 + (byte)uVar5;
    } while (puVar8 < puVar20 && (byte)uVar5 == 0xff);
    uVar26 = (ulong)uVar17 + 0xf;
  }
  if (((puVar20 <= puVar15) || (CARRY8((ulong)pbVar23,uVar26))) || (CARRY8((ulong)puVar8,uVar26)))
  goto LAB_00103bd0;
LAB_00103a15:
  source = (char *)(pbVar23 + uVar26);
  pbVar22 = pbVar23;
LAB_00103a1b:
  puVar15 = (ushort *)((long)puVar8 + uVar26);
  if ((pbVar2 + -0xc < source) || (puVar1 + -4 < puVar15)) {
    if ((puVar15 == puVar1) && (source <= pbVar2)) {
      memmove(pbVar22,puVar8,uVar26);
      puVar8 = (ushort *)(ulong)(uint)(((int)pbVar22 + (int)uVar26) - iVar7);
      goto LAB_00103909;
    }
    goto LAB_00103bd0;
  }
  do {
    *(undefined8 *)pbVar22 = *(undefined8 *)puVar8;
    pbVar22 = pbVar22 + 8;
    puVar8 = puVar8 + 4;
  } while (pbVar22 < source);
  uVar28 = (ulong)*puVar15;
  puVar8 = puVar15 + 1;
  pbVar24 = (byte *)source + -uVar28;
  uStack_70 = (ulong)(uVar11 & 0xf);
LAB_00103a60:
  if ((int)uStack_70 == 0xf) {
    uVar11 = 0;
    do {
      uVar5 = *puVar8;
      puVar8 = (ushort *)((long)puVar8 + 1);
      uVar11 = uVar11 + (byte)uVar5;
    } while (puVar8 < puVar1 + -2 && (byte)uVar5 == 0xff);
    uStack_70 = (ulong)uVar11 + 0xf;
    cVar13 = '\x05';
    if (puVar8 < puVar1 + -2) {
      cVar13 = CARRY8((ulong)source,uStack_70) * '\x05';
    }
    if (cVar13 != '\0') {
      if (cVar13 != '\x05') goto LAB_00103909;
      goto LAB_00103bd0;
    }
  }
  uStack_70 = uStack_70 + 4;
  pbVar22 = (byte *)source;
  goto LAB_00103aac;
LAB_00105103:
  if ((prefixSize < 0x10000) && (pbVar24 + prefixSize < dest)) goto LAB_001052f8;
  pbVar21 = pbVar22 + uStack_c0;
  pbVar23 = pbVar21;
  if (pbVar24 < dest) {
    if (pbVar2 + -5 < pbVar21) goto LAB_001052f8;
    uVar28 = (long)dest - (long)pbVar24;
    uVar26 = uStack_c0 - uVar28;
    if (uStack_c0 < uVar28 || uVar26 == 0) {
      memmove(pbVar22,pcVar9 + -uVar28,uStack_c0);
    }
    else {
      memcpy(pbVar22,pcVar9 + -uVar28,uVar28);
      pbVar23 = pbVar22 + uVar28;
      if ((ulong)((long)pbVar23 - (long)dest) < uVar26) {
        pbVar22 = (byte *)dest;
        if ((long)uVar28 < (long)uStack_c0) {
          do {
            *pbVar23 = *pbVar22;
            pbVar23 = pbVar23 + 1;
            pbVar22 = pbVar22 + 1;
          } while (pbVar23 < pbVar21);
        }
      }
      else {
        memcpy(pbVar23,dest,uVar26);
        pbVar23 = pbVar21;
      }
    }
  }
  else {
    if ((uint)uVar28 < 8) {
      pbVar22[0] = 0;
      pbVar22[1] = 0;
      pbVar22[2] = 0;
      pbVar22[3] = 0;
      *pbVar22 = *pbVar24;
      pbVar22[1] = pbVar24[1];
      pbVar22[2] = pbVar24[2];
      pbVar22[3] = pbVar24[3];
      uVar26 = (ulong)((uint)uVar28 << 2);
      uVar28 = (ulong)*(uint *)((long)inc32table + uVar26);
      *(undefined4 *)(pbVar22 + 4) = *(undefined4 *)(pbVar24 + uVar28);
      pbVar24 = pbVar24 + (uVar28 - (long)*(int *)((long)dec64table + uVar26));
    }
    else {
      *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
      pbVar24 = pbVar24 + 8;
    }
    pbVar10 = pbVar22 + 8;
    if (pbVar2 + -0xc < pbVar21) {
      iVar12 = 5;
      if (pbVar21 <= pbVar2 + -5) {
        pbVar22 = pbVar2 + -7;
        pbVar25 = pbVar24;
        pbVar16 = pbVar10;
        if (pbVar10 < pbVar22) {
          do {
            *(undefined8 *)pbVar16 = *(undefined8 *)pbVar25;
            pbVar16 = pbVar16 + 8;
            pbVar25 = pbVar25 + 8;
          } while (pbVar16 < pbVar22);
          pbVar24 = pbVar24 + ((long)pbVar22 - (long)pbVar10);
          pbVar10 = pbVar22;
        }
        iVar12 = 0;
        for (; pbVar10 < pbVar21; pbVar10 = pbVar10 + 1) {
          bVar3 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          *pbVar10 = bVar3;
        }
      }
      if (iVar12 != 0) {
        if (iVar12 != 5) goto LAB_00105300;
        goto LAB_001052f8;
      }
    }
    else {
      *(undefined8 *)pbVar10 = *(undefined8 *)pbVar24;
      if (0x10 < uStack_c0) {
        pbVar22 = pbVar22 + 0x10;
        do {
          pbVar24 = pbVar24 + 8;
          *(undefined8 *)pbVar22 = *(undefined8 *)pbVar24;
          pbVar22 = pbVar22 + 8;
        } while (pbVar22 < pbVar21);
      }
    }
  }
LAB_00105235:
  bVar3 = (byte)*puVar8;
  puVar14 = (ushort *)((long)puVar8 + 1);
  while( true ) {
    uVar11 = (uint)bVar3;
    if (bVar3 >> 4 == 0xf) break;
    uVar26 = (ulong)(uint)(bVar3 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar14) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar23)) goto LAB_00105056;
    uVar4 = *(undefined8 *)(puVar14 + 4);
    *(undefined8 *)pbVar23 = *(undefined8 *)puVar14;
    *(undefined8 *)(pbVar23 + 8) = uVar4;
    pbStack_a0 = pbVar23 + uVar26;
    uStack_c0 = (ulong)(uVar11 & 0xf);
    puVar15 = (ushort *)((long)puVar14 + uVar26);
    uVar28 = (ulong)*puVar15;
    pbVar24 = pbStack_a0 + -uVar28;
    if ((((uVar11 & 0xf) == 0xf) || (*puVar15 < 8)) || (pbVar24 < dest)) goto LAB_001050a6;
    *(undefined8 *)pbStack_a0 = *(undefined8 *)pbVar24;
    *(undefined8 *)(pbStack_a0 + 8) = *(undefined8 *)(pbVar24 + 8);
    *(undefined2 *)(pbStack_a0 + 0x10) = *(undefined2 *)(pbVar24 + 0x10);
    pbVar23 = pbStack_a0 + uStack_c0 + 4;
    bVar3 = *(byte *)((long)puVar14 + uVar26 + 2);
    puVar14 = (ushort *)((long)puVar14 + uVar26 + 3);
  }
  puVar15 = (ushort *)((long)puVar1 - 0xf);
  uVar26 = 0xf;
  puVar8 = puVar14;
  if (puVar14 < puVar15) {
    uVar17 = 0;
    do {
      uVar5 = *puVar8;
      puVar8 = (ushort *)((long)puVar8 + 1);
      uVar17 = uVar17 + (byte)uVar5;
    } while (puVar8 < puVar15 && (byte)uVar5 == 0xff);
    uVar26 = (ulong)uVar17 + 0xf;
  }
  if (((puVar15 <= puVar14) || (CARRY8((ulong)pbVar23,uVar26))) ||
     (puVar14 = puVar8, CARRY8((ulong)puVar8,uVar26))) goto LAB_001052f8;
LAB_00105056:
  pbStack_a0 = pbVar23 + uVar26;
  puVar8 = puVar14;
LAB_0010505a:
  puVar15 = (ushort *)((long)puVar8 + uVar26);
  if ((pbVar2 + -0xc < pbStack_a0) || (puVar1 + -4 < puVar15)) {
    if ((puVar15 != puVar1) || (pbVar2 < pbStack_a0)) goto LAB_001052f8;
    memmove(pbVar23,puVar8,uVar26);
    puVar8 = (ushort *)(ulong)(uint)(((int)pbVar23 + (int)uVar26) - iVar7);
    goto LAB_00105300;
  }
  do {
    *(undefined8 *)pbVar23 = *(undefined8 *)puVar8;
    pbVar23 = pbVar23 + 8;
    puVar8 = puVar8 + 4;
  } while (pbVar23 < pbStack_a0);
  uVar28 = (ulong)*puVar15;
  pbVar24 = pbStack_a0 + -uVar28;
  uStack_c0 = (ulong)(uVar11 & 0xf);
LAB_001050a6:
  puVar8 = puVar15 + 1;
  if ((int)uStack_c0 == 0xf) {
    uVar11 = 0;
    do {
      uVar5 = *puVar8;
      puVar8 = (ushort *)((long)puVar8 + 1);
      uVar11 = uVar11 + (byte)uVar5;
    } while (puVar8 < puVar1 + -2 && (byte)uVar5 == 0xff);
    uStack_c0 = (ulong)uVar11 + 0xf;
    cVar13 = '\x05';
    if (puVar8 < puVar1 + -2) {
      cVar13 = CARRY8((ulong)pbStack_a0,uStack_c0) * '\x05';
    }
    if (cVar13 != '\0') goto LAB_00105254;
  }
  uStack_c0 = uStack_c0 + 4;
  pbVar22 = pbStack_a0;
  goto LAB_00105103;
LAB_001048e3:
  if (pbVar21 < dest + -0x10000) goto LAB_00104a06;
  pbVar23 = pbVar24 + uStack_80;
  if ((uint)uVar28 < 8) {
    pbVar24[0] = 0;
    pbVar24[1] = 0;
    pbVar24[2] = 0;
    pbVar24[3] = 0;
    *pbVar24 = *pbVar21;
    pbVar24[1] = pbVar21[1];
    pbVar24[2] = pbVar21[2];
    pbVar24[3] = pbVar21[3];
    uVar28 = (ulong)((uint)uVar28 << 2);
    uVar26 = (ulong)*(uint *)((long)inc32table + uVar28);
    *(undefined4 *)(pbVar24 + 4) = *(undefined4 *)(pbVar21 + uVar26);
    pbVar21 = pbVar21 + (uVar26 - (long)*(int *)((long)dec64table + uVar28));
  }
  else {
    *(undefined8 *)pbVar24 = *(undefined8 *)pbVar21;
    pbVar21 = pbVar21 + 8;
  }
  pbVar22 = pbVar24 + 8;
  if (pbVar2 + -0xc < pbVar23) {
    iVar12 = 5;
    if (pbVar23 <= pbVar2 + -5) {
      pbVar24 = pbVar2 + -7;
      pbVar10 = pbVar21;
      pbVar25 = pbVar22;
      if (pbVar22 < pbVar24) {
        do {
          *(undefined8 *)pbVar25 = *(undefined8 *)pbVar10;
          pbVar25 = pbVar25 + 8;
          pbVar10 = pbVar10 + 8;
        } while (pbVar25 < pbVar24);
        pbVar21 = pbVar21 + ((long)pbVar24 - (long)pbVar22);
        pbVar22 = pbVar24;
      }
      iVar12 = 0;
      for (; pbVar22 < pbVar23; pbVar22 = pbVar22 + 1) {
        bVar3 = *pbVar21;
        pbVar21 = pbVar21 + 1;
        *pbVar22 = bVar3;
      }
    }
    if (iVar12 != 0) {
      puVar8 = (ushort *)source;
      if (iVar12 != 5) goto LAB_00104746;
      goto LAB_00104a06;
    }
  }
  else {
    *(undefined8 *)pbVar22 = *(undefined8 *)pbVar21;
    if (0x10 < uStack_80) {
      pbVar24 = pbVar24 + 0x10;
      do {
        pbVar21 = pbVar21 + 8;
        *(undefined8 *)pbVar24 = *(undefined8 *)pbVar21;
        pbVar24 = pbVar24 + 8;
      } while (pbVar24 < pbVar23);
    }
  }
LAB_00104944:
  bVar3 = (byte)*(ushort *)source;
  puVar8 = (ushort *)((long)source + 1);
  while( true ) {
    uVar11 = (uint)bVar3;
    if (bVar3 >> 4 == 0xf) break;
    uVar26 = (ulong)(uint)(bVar3 >> 4);
    if ((puVar14 <= puVar8) || (dest + (long)maxOutputSize + -0x20 < pbVar23)) goto LAB_00104848;
    uVar4 = *(undefined8 *)(puVar8 + 4);
    *(undefined8 *)pbVar23 = *(undefined8 *)puVar8;
    *(undefined8 *)(pbVar23 + 8) = uVar4;
    pbVar22 = pbVar23 + uVar26;
    uStack_80 = (ulong)(uVar11 & 0xf);
    source = (char *)((ushort *)((long)puVar8 + uVar26) + 1);
    uVar5 = *(ushort *)((long)puVar8 + uVar26);
    uVar28 = (ulong)uVar5;
    pbVar21 = pbVar22 + -uVar28;
    if (((uVar11 & 0xf) == 0xf) || (uVar5 < 8)) goto LAB_00104894;
    *(undefined8 *)pbVar22 = *(undefined8 *)pbVar21;
    *(undefined8 *)(pbVar22 + 8) = *(undefined8 *)(pbVar21 + 8);
    *(undefined2 *)(pbVar22 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
    pbVar23 = pbVar22 + uStack_80 + 4;
    bVar3 = *(byte *)((long)puVar8 + uVar26 + 2);
    puVar8 = (ushort *)((long)puVar8 + uVar26 + 3);
  }
  puVar15 = (ushort *)((long)puVar1 - 0xf);
  uVar26 = 0xf;
  source = (char *)puVar8;
  if (puVar8 < puVar15) {
    uVar17 = 0;
    do {
      uVar5 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar17 = uVar17 + (byte)uVar5;
    } while (source < puVar15 && (byte)uVar5 == 0xff);
    uVar26 = (ulong)uVar17 + 0xf;
  }
  if (((puVar15 <= puVar8) || (CARRY8((ulong)pbVar23,uVar26))) ||
     (puVar8 = (ushort *)source, CARRY8((ulong)source,uVar26))) goto LAB_00104a06;
LAB_00104848:
  pbVar22 = pbVar23 + uVar26;
LAB_0010484c:
  puVar15 = (ushort *)((long)puVar8 + uVar26);
  if ((pbVar2 + -0xc < pbVar22) || (puVar1 + -4 < puVar15)) {
    source = (char *)puVar8;
    if ((puVar15 == puVar1) && (pbVar22 <= pbVar2)) {
      memmove(pbVar23,puVar8,uVar26);
      puVar8 = (ushort *)(ulong)(uint)(((int)pbVar23 + (int)uVar26) - iVar7);
      goto LAB_00104746;
    }
    goto LAB_00104a06;
  }
  do {
    *(undefined8 *)pbVar23 = *(undefined8 *)puVar8;
    pbVar23 = pbVar23 + 8;
    puVar8 = puVar8 + 4;
  } while (pbVar23 < pbVar22);
  uVar28 = (ulong)*puVar15;
  source = (char *)(puVar15 + 1);
  pbVar21 = pbVar22 + -uVar28;
  uStack_80 = (ulong)(uVar11 & 0xf);
LAB_00104894:
  if ((int)uStack_80 == 0xf) {
    uVar11 = 0;
    do {
      uVar5 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar11 = uVar11 + (byte)uVar5;
    } while (source < puVar1 + -2 && (byte)uVar5 == 0xff);
    uStack_80 = (ulong)uVar11 + 0xf;
    cVar13 = '\x05';
    if (source < puVar1 + -2) {
      cVar13 = CARRY8((ulong)pbVar22,uStack_80) * '\x05';
    }
    if (cVar13 != '\0') {
      puVar8 = (ushort *)source;
      if (cVar13 != '\x05') goto LAB_00104746;
      goto LAB_00104a06;
    }
  }
  uStack_80 = uStack_80 + 4;
  pbVar24 = pbVar22;
  goto LAB_001048e3;
LAB_00105254:
  if (cVar13 == '\x05') {
LAB_001052f8:
    puVar8 = (ushort *)(ulong)(~(uint)puVar8 + iStack_60);
  }
LAB_00105300:
  return (int)puVar8;
LAB_00103bd0:
  puVar8 = (ushort *)(ulong)(~(uint)puVar8 + iStack_60);
LAB_00103909:
  return (int)puVar8;
LAB_00104a06:
  puVar8 = (ushort *)(ulong)(~(uint)source + iStack_60);
LAB_00104746:
  return (int)puVar8;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}